

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApplePartitionMap.hpp
# Opt level: O3

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
Storage::MassStorage::Encodings::Apple::
PartitionMap<Storage::MassStorage::Encodings::Macintosh::VolumeProvider>::convert_source_block
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          PartitionMap<Storage::MassStorage::Encodings::Macintosh::VolumeProvider> *this,
          ssize_t source_address,vector<unsigned_char,_std::allocator<unsigned_char>_> *source_data)

{
  undefined1 *this_00;
  uint uVar1;
  undefined4 uVar2;
  VolumeProvider *this_01;
  uint16_t uVar3;
  int iVar4;
  value_type_conflict3 *__val_1;
  size_t sVar5;
  pointer puVar6;
  size_t sVar7;
  char *pcVar8;
  size_t sVar9;
  uint8_t *puVar10;
  uchar uVar11;
  ulong uVar12;
  value_type_conflict3 *__val;
  long lVar13;
  initializer_list<unsigned_char> __l;
  Partition partitions [3];
  undefined8 auStack_b8 [2];
  uint uStack_a8;
  allocator_type local_a1;
  VolumeProvider *local_a0;
  undefined8 local_98;
  char *local_90;
  undefined1 local_88;
  undefined1 uStack_87;
  undefined2 uStack_86;
  undefined2 local_84;
  undefined1 uStack_82;
  undefined1 uStack_81;
  undefined2 local_80;
  char *local_78;
  char *local_70;
  undefined8 local_68;
  undefined1 local_60;
  char *local_58;
  char *local_50;
  undefined4 local_48;
  undefined4 local_44;
  undefined1 local_40;
  
  if (source_address < 0) {
    this_00 = &this->field_0x10;
    auStack_b8[1] = 0x446ab5;
    sVar5 = Macintosh::VolumeProvider::driver_size((VolumeProvider *)this_00);
    lVar13 = source_address + (sVar5 + 0x1ff >> 9);
    uVar12 = lVar13 + 0x40;
    if (uVar12 == 0) {
      sVar5 = this->number_of_blocks_;
      auStack_b8[1] = 0x446d17;
      sVar9 = Macintosh::VolumeProvider::driver_size((VolumeProvider *)this_00);
      lVar13 = sVar5 + (sVar9 + 0x1ff >> 9) + 0x40;
      auStack_b8[1] = 0x446d33;
      sVar5 = Macintosh::VolumeProvider::driver_size((VolumeProvider *)this_00);
      uVar12 = sVar5 + 0x1ff;
      uStack_81 = (undefined1)(uVar12 >> 9);
      uStack_87 = (uVar12 & 0x1fffe00) != 0;
      local_98 = (char *)CONCAT17((char)lVar13,
                                  CONCAT16((char)((ulong)lVar13 >> 8),
                                           CONCAT15((char)((ulong)lVar13 >> 0x10),
                                                    CONCAT14((char)((ulong)lVar13 >> 0x18),0x25245))
                                          ));
      local_90 = (char *)0x1000100;
      local_88 = 0;
      uStack_86 = 0;
      local_84 = 0x4000;
      uStack_82 = (undefined1)((uint)uVar12 >> 0x11);
      local_80 = 0x100;
      auStack_b8[1] = 0x446d9b;
      __l._M_len = 0x1a;
      __l._M_array = (iterator)&local_98;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (__return_storage_ptr__,__l,&local_a1);
      auStack_b8[1] = 0x446da8;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                (__return_storage_ptr__,0x200);
    }
    else if ((long)uVar12 < 4) {
      auStack_b8[1] = 0x446ae1;
      local_98 = Macintosh::VolumeProvider::name((VolumeProvider *)this_00);
      auStack_b8[1] = 0x446aee;
      local_90 = Macintosh::VolumeProvider::type((VolumeProvider *)this_00);
      auStack_b8[1] = 0x446afb;
      sVar5 = Macintosh::VolumeProvider::driver_size((VolumeProvider *)this_00);
      iVar4 = (int)(sVar5 + 0x1ff >> 9) + 0x40;
      local_88 = (undefined1)iVar4;
      uStack_87 = (undefined1)((uint)iVar4 >> 8);
      uStack_86 = (undefined2)((uint)iVar4 >> 0x10);
      uVar2 = (undefined4)this->number_of_blocks_;
      local_84 = (undefined2)uVar2;
      uStack_82 = (undefined1)((uint)uVar2 >> 0x10);
      uStack_81 = (undefined1)((uint)uVar2 >> 0x18);
      local_80 = CONCAT11(local_80._1_1_,0xb7);
      local_78 = "Apple";
      local_70 = "Apple_partition_map";
      local_68 = 0x3f00000001;
      local_60 = 0x37;
      local_58 = "Macintosh";
      local_50 = "Apple_Driver";
      local_48 = 0x40;
      auStack_b8[1] = 0x446b76;
      local_a0 = (VolumeProvider *)this_00;
      sVar5 = Macintosh::VolumeProvider::driver_size((VolumeProvider *)this_00);
      local_44 = (undefined4)(sVar5 + 0x1ff >> 9);
      local_40 = 0x7f;
      (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      auStack_b8[1] = 0x446b9f;
      puVar6 = (pointer)operator_new(0x200);
      (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
      _M_impl.super__Vector_impl_data._M_start = puVar6;
      (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage = puVar6 + 0x200;
      auStack_b8[1] = 0x446bc0;
      memset(puVar6 + 2,0,0x1fe);
      (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
      _M_impl.super__Vector_impl_data._M_finish = puVar6 + 0x200;
      puVar6[0] = 'P';
      puVar6[1] = 'M';
      puVar6[7] = '\x03';
      uVar1 = (&uStack_a8)[uVar12 * 8];
      *(uint *)(puVar6 + 8) =
           uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
      uVar2 = *(undefined4 *)(&stack0xffffffffffffff5c + uVar12 * 0x20);
      uVar11 = (uchar)((uint)uVar2 >> 0x18);
      puVar6[0xc] = uVar11;
      puVar6[0x54] = uVar11;
      uVar11 = (uchar)((uint)uVar2 >> 0x10);
      puVar6[0xd] = uVar11;
      puVar6[0x55] = uVar11;
      uVar11 = (uchar)((uint)uVar2 >> 8);
      puVar6[0xe] = uVar11;
      puVar6[0x56] = uVar11;
      puVar6[0xf] = (uchar)uVar2;
      puVar6[0x57] = (uchar)uVar2;
      pcVar8 = (char *)auStack_b8[uVar12 * 4];
      auStack_b8[1] = 0x446c2c;
      sVar7 = strlen(pcVar8);
      auStack_b8[1] = 0x446c3a;
      memcpy(puVar6 + 0x10,pcVar8,sVar7);
      pcVar8 = (char *)auStack_b8[uVar12 * 4 + 1];
      auStack_b8[1] = 0x446c53;
      sVar7 = strlen(pcVar8);
      auStack_b8[1] = 0x446c61;
      memcpy(puVar6 + 0x30,pcVar8,sVar7);
      this_01 = local_a0;
      puVar6[0x5b] = *(uchar *)(&local_a0 + uVar12 * 4);
      if (uVar12 == 3) {
        auStack_b8[1] = 0x446c85;
        sVar5 = Macintosh::VolumeProvider::driver_size(local_a0);
        auStack_b8[1] = 0x446c90;
        uVar3 = Macintosh::VolumeProvider::driver_checksum(this_01);
        (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
        _M_impl.super__Vector_impl_data._M_start[0x62] = (uchar)(sVar5 >> 8);
        (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
        _M_impl.super__Vector_impl_data._M_start[99] = (uchar)sVar5;
        (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
        _M_impl.super__Vector_impl_data._M_start[0x76] = (uchar)(uVar3 >> 8);
        (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
        _M_impl.super__Vector_impl_data._M_start[0x77] = (uchar)uVar3;
        auStack_b8[1] = 0x446cb3;
        pcVar8 = Macintosh::VolumeProvider::driver_target(this_01);
        puVar6 = (__return_storage_ptr__->
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        auStack_b8[1] = 0x446cc5;
        sVar7 = strlen(pcVar8);
        auStack_b8[1] = 0x446cd3;
        memcpy(puVar6 + 0x78,pcVar8,sVar7);
        (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
        _M_impl.super__Vector_impl_data._M_start[0x89] = '\x01';
        (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
        _M_impl.super__Vector_impl_data._M_start[0x8a] = '\x06';
        (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
        _M_impl.super__Vector_impl_data._M_start[0x8f] = '\x01';
        (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
        _M_impl.super__Vector_impl_data._M_start[0x93] = '\x02';
        (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
        _M_impl.super__Vector_impl_data._M_start[0x95] = '\a';
      }
    }
    else {
      if (0x3f < uVar12) {
        auStack_b8[1] = 0x446dbb;
        sVar5 = Macintosh::VolumeProvider::driver_size((VolumeProvider *)this_00);
        if (uVar12 < (sVar5 + 0x1ff >> 9) + 0x40) {
          auStack_b8[1] = 0x446dd6;
          puVar10 = Macintosh::VolumeProvider::driver((VolumeProvider *)this_00);
          lVar13 = lVar13 * 0x200;
          auStack_b8[1] = 0x446df6;
          std::vector<unsigned_char,std::allocator<unsigned_char>>::
          vector<unsigned_char_const*,void>
                    ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,
                     puVar10 + lVar13,puVar10 + lVar13 + 0x200,(allocator_type *)&local_98);
          return __return_storage_ptr__;
        }
      }
      (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      auStack_b8[1] = 0x446e14;
      puVar6 = (pointer)operator_new(0x200);
      (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
      _M_impl.super__Vector_impl_data._M_start = puVar6;
      (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage = puVar6 + 0x200;
      auStack_b8[1] = 0x446e31;
      memset(puVar6,0,0x200);
      (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
      _M_impl.super__Vector_impl_data._M_finish = puVar6 + 0x200;
    }
  }
  else {
    puVar6 = (source_data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
             _M_impl.super__Vector_impl_data._M_finish;
    (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
    _M_impl.super__Vector_impl_data._M_start =
         (source_data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
         super__Vector_impl_data._M_start;
    (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
    _M_impl.super__Vector_impl_data._M_finish = puVar6;
    (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         (source_data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    (source_data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (source_data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (source_data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint8_t> convert_source_block(ssize_t source_address, std::vector<uint8_t> source_data = {}) {
			// Addresses greater than or equal to zero map to the actual disk image.
			if(source_address >= 0) return source_data;

			// Switch to mapping relative to 0, for personal sanity.
			source_address += non_volume_blocks();

			// Block 0 is the device descriptor, which lists the total number of blocks,
			// and provides an offset to the driver, if any.
			if(!source_address) {
				const uint32_t total_device_blocks = uint32_t(get_number_of_blocks());
				const auto driver_size = uint16_t(driver_block_size());
				const auto driver_offset = uint16_t(predriver_blocks());
				const uint8_t driver_count = driver_size > 0 ? 1 : 0;

				/* The driver descriptor. */
				std::vector<uint8_t> driver_description = {
					0x45, 0x52,		/* device signature */
					0x02, 0x00,		/* block size, in bytes */

					uint8_t(total_device_blocks >> 24),
					uint8_t(total_device_blocks >> 16),
					uint8_t(total_device_blocks >> 8),
					uint8_t(total_device_blocks),
									/* number of blocks on device */

					0x00, 0x01,		/* reserved (formerly: device type) */
					0x00, 0x01,		/* reserved (formerly: device ID) */
					0x00, 0x00,
					0x00, 0x00,		/* reserved ('sbData', no further explanation given) */

					0x00, driver_count,		/* number of device descriptor entries */
					0x00, 0x00,

					/* first device descriptor's starting block */
					uint8_t(driver_offset >> 8), uint8_t(driver_offset),

					/* size of device driver */
					uint8_t(driver_size >> 8), uint8_t(driver_size),

					0x00, 0x01,		/*
										More modern documentation: operating system (MacOS = 1)
										Inside Macintosh IV: system type (Mac Plus = 1)
									*/
				};
				driver_description.resize(512);

				return driver_description;
			}

			// Blocks 1 and 2 contain entries of the partition map; there's also possibly an entry
			// for the driver.
			if(source_address < 3 + volume_provider_.HasDriver) {
				struct Partition {
					const char *name, *type;
					uint32_t start_block, size;
					uint8_t status;
				} partitions[3] = {
					{
						volume_provider_.name(),
						volume_provider_.type(),
						uint32_t(non_volume_blocks()),
						uint32_t(number_of_blocks_),
						0xb7
					},
					{
						"Apple",
						"Apple_partition_map",
						0x01,
						uint32_t(predriver_blocks()) - 1,
						0x37
					},
					{
						"Macintosh",
						"Apple_Driver",
						uint32_t(predriver_blocks()),
						uint32_t(driver_block_size()),
						0x7f
					},
				};

				std::vector<uint8_t> partition(512);

				// Fill in the fixed fields.
				partition[0] = 'P';	partition[1] = 'M';	/* Signature. */
				partition[7] = 3;						/* Number of partitions. */

				const Partition &details = partitions[source_address-1];

				partition[8] = uint8_t(details.start_block >> 24);
				partition[9] = uint8_t(details.start_block >> 16);
				partition[10] = uint8_t(details.start_block >> 8);
				partition[11] = uint8_t(details.start_block);

				partition[84] = partition[12] = uint8_t(details.size >> 24);
				partition[85] = partition[13] = uint8_t(details.size >> 16);
				partition[86] = partition[14] = uint8_t(details.size >> 8);
				partition[87] = partition[15] = uint8_t(details.size);

				// 32 bytes are allocated for each of the following strings.
				memcpy(&partition[16], details.name, strlen(details.name));
				memcpy(&partition[48], details.type, strlen(details.type));

				partition[91] = details.status;

				// The third entry in this constructed partition map is the driver;
				// add some additional details.
				if constexpr (VolumeProvider::HasDriver) {
					if(source_address == 3) {
						const auto driver_size = uint16_t(volume_provider_.driver_size());
						const auto driver_checksum = uint16_t(volume_provider_.driver_checksum());

						/* Driver size in bytes. */
						partition[98] = uint8_t(driver_size >> 8);
						partition[99] = uint8_t(driver_size);

						/* Driver checksum. */
						partition[118] = uint8_t(driver_checksum >> 8);
						partition[119] = uint8_t(driver_checksum);

						/* Driver target processor. */
						const char *driver_target = volume_provider_.driver_target();
						memcpy(&partition[120], driver_target, strlen(driver_target));

						// Various non-zero values that Apple HD SC Tool wrote are below; they are
						// documented as reserved officially, so I don't know their meaning.
						partition[137] = 0x01;
						partition[138] = 0x06;
						partition[143] = 0x01;
						partition[147] = 0x02;
						partition[149] = 0x07;
					}
				}

				return partition;
			}

			if constexpr (VolumeProvider::HasDriver) {
				// The remainder of the non-volume area is the driver.
				if(source_address >= predriver_blocks() && source_address < non_volume_blocks()) {
					const uint8_t *driver = volume_provider_.driver();
					const auto offset = (source_address - predriver_blocks()) * 512;
					return std::vector<uint8_t>(&driver[offset], &driver[offset + 512]);
				}
			}

			// Default: return an empty block.
			return std::vector<uint8_t>(512);
		}